

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StaticAnalyser.cpp
# Opt level: O2

TargetList * Analyser::Static::GetTargets(TargetList *__return_storage_ptr__,string *file_name)

{
  pointer puVar1;
  Target *pTVar2;
  pointer psVar3;
  __normal_iterator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_*,_std::vector<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>_>
  __seed;
  unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_> *puVar4;
  bool bVar5;
  TargetList *__range1;
  shared_ptr<Storage::Tape::Tape> *tape;
  pointer psVar6;
  unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_> *target;
  pointer puVar7;
  anon_class_32_4_a56973ca append;
  IntType potential_platforms;
  _Temporary_buffer<__gnu_cxx::__normal_iterator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_*,_std::vector<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>_>,_std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>
  local_d8;
  anon_class_24_3_78b262ea try_snapshot;
  string extension;
  Media media;
  
  anon_unknown.dwarf_3c1d49::get_extension(&extension,file_name);
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  try_snapshot.extension = &extension;
  try_snapshot.file_name = file_name;
  try_snapshot.targets = __return_storage_ptr__;
  bVar5 = GetTargets(std::__cxx11::string_const&)::$_1::operator()
                    (&try_snapshot,"sna",Storage::State::SNA::load);
  if (!bVar5) {
    bVar5 = GetTargets(std::__cxx11::string_const&)::$_1::operator()
                      (&try_snapshot,"szx",Storage::State::SZX::load);
    if (!bVar5) {
      bVar5 = GetTargets(std::__cxx11::string_const&)::$_1::operator()
                        (&try_snapshot,"z80",Storage::State::Z80::load);
      if (!bVar5) {
        potential_platforms = 0;
        GetMediaAndPlatforms(&media,file_name,&potential_platforms);
        append.potential_platforms = &potential_platforms;
        append.media = &media;
        append.file_name = file_name;
        append.targets = __return_storage_ptr__;
        GetTargets(std::__cxx11::string_const&)::$_0::operator()(&append,0x760,Acorn::GetTargets);
        GetTargets(std::__cxx11::string_const&)::$_0::operator()(&append,1,AmstradCPC::GetTargets);
        GetTargets(std::__cxx11::string_const&)::$_0::operator()(&append,2,AppleII::GetTargets);
        GetTargets(std::__cxx11::string_const&)::$_0::operator()(&append,4,AppleIIgs::GetTargets);
        GetTargets(std::__cxx11::string_const&)::$_0::operator()(&append,0x80,Amiga::GetTargets);
        GetTargets(std::__cxx11::string_const&)::$_0::operator()(&append,8,Atari2600::GetTargets);
        GetTargets(std::__cxx11::string_const&)::$_0::operator()(&append,0x10,AtariST::GetTargets);
        GetTargets(std::__cxx11::string_const&)::$_0::operator()(&append,0x800,Coleco::GetTargets);
        GetTargets(std::__cxx11::string_const&)::$_0::operator()
                  (&append,0x1000,Commodore::GetTargets);
        GetTargets(std::__cxx11::string_const&)::$_0::operator()(&append,0x2000,DiskII::GetTargets);
        GetTargets(std::__cxx11::string_const&)::$_0::operator()
                  (&append,0x4000,Enterprise::GetTargets);
        GetTargets(std::__cxx11::string_const&)::$_0::operator()(&append,0x800000,FAT12::GetTargets)
        ;
        GetTargets(std::__cxx11::string_const&)::$_0::operator()
                  (&append,0x10000,Macintosh::GetTargets);
        GetTargets(std::__cxx11::string_const&)::$_0::operator()(&append,0x20000,MSX::GetTargets);
        GetTargets(std::__cxx11::string_const&)::$_0::operator()(&append,0x40000,Oric::GetTargets);
        GetTargets(std::__cxx11::string_const&)::$_0::operator()
                  (&append,0x400000,PCCompatible::GetTargets);
        GetTargets(std::__cxx11::string_const&)::$_0::operator()(&append,0x8000,Sega::GetTargets);
        GetTargets(std::__cxx11::string_const&)::$_0::operator()
                  (&append,0x180000,ZX8081::GetTargets);
        GetTargets(std::__cxx11::string_const&)::$_0::operator()
                  (&append,0x200000,ZXSpectrum::GetTargets);
        puVar1 = (__return_storage_ptr__->
                 super__Vector_base<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        for (puVar7 = (__return_storage_ptr__->
                      super__Vector_base<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start; puVar7 != puVar1;
            puVar7 = puVar7 + 1) {
          pTVar2 = (puVar7->_M_t).
                   super___uniq_ptr_impl<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Analyser::Static::Target_*,_std::default_delete<Analyser::Static::Target>_>
                   .super__Head_base<0UL,_Analyser::Static::Target_*,_false>._M_head_impl;
          psVar3 = *(pointer *)((long)&(pTVar2->media).tapes + 8);
          for (psVar6 = *(pointer *)
                         &(pTVar2->media).tapes.
                          super__Vector_base<std::shared_ptr<Storage::Tape::Tape>,_std::allocator<std::shared_ptr<Storage::Tape::Tape>_>_>
                          ._M_impl; psVar6 != psVar3; psVar6 = psVar6 + 1) {
            Storage::Tape::Tape::reset
                      ((psVar6->super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>)
                       ._M_ptr);
          }
        }
        __seed._M_current =
             (__return_storage_ptr__->
             super__Vector_base<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
        puVar4 = (__return_storage_ptr__->
                 super__Vector_base<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        if (__seed._M_current != puVar4) {
          std::
          _Temporary_buffer<__gnu_cxx::__normal_iterator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_*,_std::vector<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>_>,_std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>
          ::_Temporary_buffer(&local_d8,__seed,
                              (((long)puVar4 - (long)__seed._M_current >> 3) + 1) / 2);
          if (local_d8._M_buffer == (pointer)0x0) {
            std::
            __inplace_stable_sort<__gnu_cxx::__normal_iterator<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>*,std::vector<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::allocator<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>,__gnu_cxx::__ops::_Iter_comp_iter<Analyser::Static::GetTargets(std::__cxx11::string_const&)::__2>>
                      (__seed._M_current,puVar4);
          }
          else {
            std::
            __stable_sort_adaptive<__gnu_cxx::__normal_iterator<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>*,std::vector<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::allocator<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>*,long,__gnu_cxx::__ops::_Iter_comp_iter<Analyser::Static::GetTargets(std::__cxx11::string_const&)::__2>>
                      (__seed._M_current,puVar4,local_d8._M_buffer,local_d8._M_len);
          }
          std::
          _Temporary_buffer<__gnu_cxx::__normal_iterator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_*,_std::vector<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>_>,_std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>
          ::~_Temporary_buffer(&local_d8);
        }
        Media::~Media(&media);
      }
    }
  }
  std::__cxx11::string::~string((string *)&extension);
  return __return_storage_ptr__;
}

Assistant:

TargetList Analyser::Static::GetTargets(const std::string &file_name) {
	const std::string extension = get_extension(file_name);
	TargetList targets;

	// Check whether the file directly identifies a target; if so then just return that.
	const auto try_snapshot = [&](const char *ext, auto loader) -> bool {
		if(extension != ext) {
			return false;
		}
		try {
			auto target = loader(file_name);
			if(target) {
				targets.push_back(std::move(target));
				return true;
			}
		} catch(...) {}

		return false;
	};

	if(try_snapshot("sna", Storage::State::SNA::load)) return targets;
	if(try_snapshot("szx", Storage::State::SZX::load)) return targets;
	if(try_snapshot("z80", Storage::State::Z80::load)) return targets;

	// Otherwise:
	//
	// Collect all disks, tapes ROMs, etc as can be extrapolated from this file, forming the
	// union of all platforms this file might be a target for.
	TargetPlatform::IntType potential_platforms = 0;
	Media media = GetMediaAndPlatforms(file_name, potential_platforms);

	// Hand off to platform-specific determination of whether these
	// things are actually compatible and, if so, how to load them.
	const auto append = [&](TargetPlatform::IntType platform, auto evaluator) {
		if(!(potential_platforms & platform)) {
			return;
		}
		auto new_targets = evaluator(media, file_name, potential_platforms);
		std::move(new_targets.begin(), new_targets.end(), std::back_inserter(targets));
	};

	append(TargetPlatform::Acorn, Acorn::GetTargets);
	append(TargetPlatform::AmstradCPC, AmstradCPC::GetTargets);
	append(TargetPlatform::AppleII, AppleII::GetTargets);
	append(TargetPlatform::AppleIIgs, AppleIIgs::GetTargets);
	append(TargetPlatform::Amiga, Amiga::GetTargets);
	append(TargetPlatform::Atari2600, Atari2600::GetTargets);
	append(TargetPlatform::AtariST, AtariST::GetTargets);
	append(TargetPlatform::Coleco, Coleco::GetTargets);
	append(TargetPlatform::Commodore, Commodore::GetTargets);
	append(TargetPlatform::DiskII, DiskII::GetTargets);
	append(TargetPlatform::Enterprise, Enterprise::GetTargets);
	append(TargetPlatform::FAT12, FAT12::GetTargets);
	append(TargetPlatform::Macintosh, Macintosh::GetTargets);
	append(TargetPlatform::MSX, MSX::GetTargets);
	append(TargetPlatform::Oric, Oric::GetTargets);
	append(TargetPlatform::PCCompatible, PCCompatible::GetTargets);
	append(TargetPlatform::Sega, Sega::GetTargets);
	append(TargetPlatform::ZX8081, ZX8081::GetTargets);
	append(TargetPlatform::ZXSpectrum, ZXSpectrum::GetTargets);

	// Reset any tapes to their initial position.
	for(const auto &target : targets) {
		for(auto &tape : target->media.tapes) {
			tape->reset();
		}
	}

	// Sort by initial confidence. Use a stable sort in case any of the machine-specific analysers
	// picked their insertion order carefully.
	std::stable_sort(targets.begin(), targets.end(),
		[] (const std::unique_ptr<Target> &a, const std::unique_ptr<Target> &b) {
			return a->confidence > b->confidence;
		});

	return targets;
}